

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool mkvparser::Match(IMkvReader *pReader,longlong *pos,unsigned_long expected_id,uchar **buf,
                     size_t *buflen)

{
  int iVar1;
  IMkvReader *pReader_00;
  long *len_00;
  unsigned_long_long element_size;
  uchar *puVar2;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  unsigned_long_long *in_R8;
  long buflen_;
  unsigned_long_long rollover_check;
  longlong size;
  longlong id;
  long len;
  long status;
  longlong available;
  longlong total;
  unsigned_long_long uVar3;
  long pos_00;
  long pos_01;
  IMkvReader *pReader_01;
  bool local_1;
  
  if ((in_RDI == (long *)0x0) || (*in_RSI < 0)) {
    local_1 = false;
  }
  else {
    pReader_01 = (IMkvReader *)0x0;
    pos_01 = 0;
    iVar1 = (**(code **)(*in_RDI + 8))(in_RDI,&stack0xffffffffffffffc8,&stack0xffffffffffffffc0);
    pReader_00 = (IMkvReader *)(long)iVar1;
    if (((long)pReader_00 < 0) || ((-1 < (long)pReader_01 && ((long)pReader_01 < pos_01)))) {
      local_1 = false;
    }
    else {
      pos_00 = 0;
      len_00 = (long *)ReadID(pReader_01,pos_01,(long *)pReader_00);
      if (((long)len_00 < 0) || (pos_00 < pos_01 - *in_RSI)) {
        local_1 = false;
      }
      else if (len_00 == in_RDX) {
        *in_RSI = pos_00 + *in_RSI;
        element_size = ReadUInt(pReader_00,pos_00,len_00);
        if (((((long)element_size < 0) || (pos_00 < 1)) || (8 < pos_00)) ||
           (pos_00 < pos_01 - *in_RSI)) {
          local_1 = false;
        }
        else if ((ulong)(*in_RSI + pos_00) < 0x8000000000000000) {
          *in_RSI = pos_00 + *in_RSI;
          if (*in_RSI + element_size < 0x8000000000000000) {
            if (pos_01 < (long)(*in_RSI + element_size)) {
              local_1 = false;
            }
            else if ((long)element_size < 0x7fffffffffffffff) {
              uVar3 = element_size;
              puVar2 = SafeArrayAlloc<unsigned_char>((unsigned_long_long)len_00,element_size);
              *in_RCX = (long)puVar2;
              if (*in_RCX == 0) {
                local_1 = false;
              }
              else {
                iVar1 = (**(code **)*in_RDI)(in_RDI,*in_RSI,element_size,*in_RCX);
                if (iVar1 == 0) {
                  *in_R8 = element_size;
                  *in_RSI = uVar3 + *in_RSI;
                  local_1 = true;
                }
                else {
                  local_1 = false;
                }
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool Match(IMkvReader* pReader, long long& pos, unsigned long expected_id,
           unsigned char*& buf, size_t& buflen) {
  if (!pReader || pos < 0)
    return false;

  long long total = 0;
  long long available = 0;

  long status = pReader->Length(&total, &available);
  if (status < 0 || (total >= 0 && available > total))
    return false;

  long len = 0;
  const long long id = ReadID(pReader, pos, len);
  if (id < 0 || (available - pos) > len)
    return false;

  if (static_cast<unsigned long>(id) != expected_id)
    return false;

  pos += len;  // consume id

  const long long size = ReadUInt(pReader, pos, len);
  if (size < 0 || len <= 0 || len > 8 || (available - pos) > len)
    return false;

  unsigned long long rollover_check =
      static_cast<unsigned long long>(pos) + len;
  if (rollover_check > LLONG_MAX)
    return false;

  pos += len;  // consume length of size of payload

  rollover_check = static_cast<unsigned long long>(pos) + size;
  if (rollover_check > LLONG_MAX)
    return false;

  if ((pos + size) > available)
    return false;

  if (size >= LONG_MAX)
    return false;

  const long buflen_ = static_cast<long>(size);

  buf = SafeArrayAlloc<unsigned char>(1, buflen_);
  if (!buf)
    return false;

  status = pReader->Read(pos, buflen_, buf);
  if (status != 0)
    return false;

  buflen = buflen_;

  pos += size;  // consume size of payload
  return true;
}